

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

_Bool plutovg_path_parse(plutovg_path_t *path,char *data,int length)

{
  byte bVar1;
  _Bool _Var2;
  size_t sVar3;
  plutovg_path_element_t *ppVar4;
  byte bVar5;
  byte *pbVar6;
  byte *end;
  long lVar7;
  byte bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  _Bool flags [2];
  _Bool local_aa;
  _Bool local_a9;
  plutovg_point_t local_a8;
  undefined8 uStack_a0;
  plutovg_point_t local_98;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  byte *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  if (length == -1) {
    sVar3 = strlen(data);
    length = (int)sVar3;
  }
  local_80 = (byte *)data;
  lVar7 = (long)length;
  if (length < 1) {
LAB_0010aac8:
    end = (byte *)(data + length);
    if (local_80 < end) {
      fVar10 = 0.0;
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      uStack_a0._0_4_ = 0.0;
      uStack_a0._4_4_ = 0.0;
      bVar1 = 0;
      do {
        bVar5 = *local_80;
        bVar8 = bVar1;
        if (((byte)((bVar5 & 0xdf) + 0xbf) < 0x1a) &&
           (pbVar6 = local_80 + 1, bVar8 = bVar5, local_80 = pbVar6, pbVar6 < end)) {
          while (local_80 = pbVar6, (ulong)*pbVar6 < 0x21) {
            if (((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0) ||
               (pbVar6 = pbVar6 + 1, local_80 = end, pbVar6 == end)) break;
          }
        }
        if (bVar1 == 0) {
          if ((bVar8 | 0x20) != 0x6d) {
            return false;
          }
LAB_0010abc7:
          _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,0,2);
          if (!_Var2) {
            return false;
          }
          fVar10 = local_98.x;
          bVar9 = bVar8 == 0x6d;
          bVar8 = 0x4c;
          if (bVar9) {
            uStack_a0 = CONCAT44(uStack_a0._4_4_ + 0.0,(float)uStack_a0 + 0.0);
            local_98.y = local_98.y + local_a8.y;
            local_98.x = fVar10 + local_a8.x;
            bVar8 = 0x6c;
          }
          else {
            uStack_a0 = 0;
          }
          local_a8 = local_98;
          ppVar4 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
          ppVar4->point = local_a8;
          path->start_point = local_a8;
          path->num_contours = path->num_contours + 1;
          fVar10 = local_98.x;
          fVar11 = local_98.y;
          fVar12 = 0.0;
          fVar13 = 0.0;
          fVar14 = local_98.x;
          fVar16 = local_98.y;
          fVar17 = 0.0;
          fVar15 = 0.0;
        }
        else {
          bVar5 = bVar8 | 0x20;
          if (bVar5 == 0x6d) goto LAB_0010abc7;
          local_78 = fVar10;
          fStack_74 = fVar11;
          fStack_70 = fVar12;
          fStack_6c = fVar13;
          if (bVar5 == 0x6c) {
            _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,0,2);
            if (!_Var2) {
              return false;
            }
            fVar10 = local_98.x;
            fVar11 = local_98.y;
            fVar12 = 0.0;
            fVar13 = 0.0;
            if (bVar8 == 0x6c) {
              fVar10 = fVar10 + local_a8.x;
              fVar11 = fVar11 + local_a8.y;
              fVar12 = (float)uStack_a0 + 0.0;
              fVar13 = uStack_a0._4_4_ + 0.0;
              local_98.y = fVar11;
              local_98.x = fVar10;
            }
            local_a8.y = fVar11;
            local_a8.x = fVar10;
            uStack_a0 = CONCAT44(fVar13,fVar12);
            plutovg_path_line_to(path,fVar10,fVar11);
LAB_0010abb1:
            fVar10 = local_78;
            fVar11 = fStack_74;
            fVar12 = fStack_70;
            fVar13 = fStack_6c;
            fVar14 = local_a8.x;
            fVar16 = local_a8.y;
            fVar17 = (float)uStack_a0;
            fVar15 = uStack_a0._4_4_;
          }
          else if (bVar5 == 0x68) {
            _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,0,1);
            if (!_Var2) {
              return false;
            }
            fVar10 = local_98.x;
            if (bVar8 == 0x68) {
              fVar10 = local_98.x + local_a8.x;
              local_98.x = fVar10;
            }
            local_48 = ZEXT416((uint)fVar10);
            plutovg_path_line_to(path,fVar10,local_a8.y);
            fVar10 = local_78;
            fVar11 = fStack_74;
            fVar12 = fStack_70;
            fVar13 = fStack_6c;
            fVar14 = (float)local_48._0_4_;
            fVar16 = local_a8.y;
            fVar17 = (float)uStack_a0;
            fVar15 = uStack_a0._4_4_;
          }
          else {
            if (bVar5 != 0x76) {
              if (bVar5 == 0x71) {
                _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,0,4);
                if (!_Var2) {
                  return false;
                }
                fVar10 = local_98.x;
                fVar11 = local_98.y;
                fVar13 = 0.0;
                fVar14 = 0.0;
                fVar16 = 0.0;
                fVar17 = 0.0;
                fVar12 = fVar11;
                if (bVar8 == 0x71) {
                  fVar10 = fVar10 + local_a8.x;
                  fVar11 = fVar11 + local_a8.y;
                  fVar13 = (float)uStack_a0 + 0.0;
                  fVar14 = uStack_a0._4_4_ + 0.0;
                  fStack_90 = fStack_90 + local_a8.x;
                  fStack_8c = fStack_8c + local_a8.y;
                  fVar16 = (float)uStack_a0 + 0.0;
                  fVar17 = uStack_a0._4_4_ + 0.0;
                  local_98.y = fVar11;
                  local_98.x = fVar10;
                  fVar12 = fVar11;
                }
LAB_0010ad52:
                local_58 = CONCAT44(fVar12,fVar10);
                uStack_50 = CONCAT44(fVar14,fVar13);
                local_68 = CONCAT44(fVar12,fVar11);
                uStack_60 = CONCAT44(fVar12,fVar12);
                local_a8.y = fStack_8c;
                local_a8.x = fStack_90;
                uStack_a0 = CONCAT44(fVar17,fVar16);
                plutovg_path_quad_to(path,fVar10,fVar11,fStack_90,fStack_8c);
              }
              else {
                if (bVar5 == 99) {
                  _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,0,6);
                  if (!_Var2) {
                    return false;
                  }
                  fVar14 = 0.0;
                  fVar16 = 0.0;
                  fVar10 = local_98.x;
                  fVar11 = local_98.y;
                  fVar12 = fStack_90;
                  fVar13 = fStack_8c;
                  if (bVar8 == 99) {
                    fVar10 = local_98.x + local_a8.x;
                    fVar11 = local_98.y + local_a8.y;
                    fVar12 = fStack_90 + local_a8.x;
                    fVar13 = fStack_8c + local_a8.y;
                    local_98.y = fVar11;
                    local_98.x = fVar10;
                    fStack_88 = fStack_88 + local_a8.x;
                    fStack_84 = fStack_84 + local_a8.y;
                    fVar14 = (float)uStack_a0 + 0.0;
                    fVar16 = uStack_a0._4_4_ + 0.0;
                    fStack_90 = fVar12;
                    fStack_8c = fVar13;
                  }
                }
                else {
                  local_98.y = local_a8.y;
                  local_98.x = local_a8.x;
                  if (bVar5 == 0x74) {
                    if ((bVar1 - 0x51 < 0x24) &&
                       ((0x900000009U >> ((ulong)(bVar1 - 0x51) & 0x3f) & 1) != 0)) {
                      local_98.y = (local_a8.y + local_a8.y) - (float)local_68;
                      local_98.x = (local_a8.x + local_a8.x) - (float)local_58;
                    }
                    _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,2,2);
                    if (!_Var2) {
                      return false;
                    }
                    fVar16 = 0.0;
                    fVar17 = 0.0;
                    if (bVar8 == 0x74) {
                      fStack_90 = fStack_90 + local_a8.x;
                      fStack_8c = fStack_8c + local_a8.y;
                      fVar16 = (float)uStack_a0 + 0.0;
                      fVar17 = uStack_a0._4_4_ + 0.0;
                    }
                    fVar13 = 0.0;
                    fVar14 = 0.0;
                    fVar10 = local_98.x;
                    fVar11 = local_98.y;
                    fVar12 = 0.0;
                    goto LAB_0010ad52;
                  }
                  if (bVar5 != 0x73) {
                    if (bVar5 == 0x61) {
                      _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,0,3)
                      ;
                      if (!_Var2) {
                        return false;
                      }
                      _Var2 = parse_arc_flag((char **)&local_80,(char *)end,&local_aa);
                      if (!_Var2) {
                        return false;
                      }
                      _Var2 = parse_arc_flag((char **)&local_80,(char *)end,&local_a9);
                      if (!_Var2) {
                        return false;
                      }
                      _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,3,2)
                      ;
                      if (!_Var2) {
                        return false;
                      }
                      fVar10 = 0.0;
                      fVar11 = 0.0;
                      if (bVar8 == 0x61) {
                        fStack_8c = fStack_8c + local_a8.x;
                        fStack_88 = fStack_88 + local_a8.y;
                        fVar10 = (float)uStack_a0 + 0.0;
                        fVar11 = uStack_a0._4_4_ + 0.0;
                      }
                      local_a8.y = fStack_88;
                      local_a8.x = fStack_8c;
                      uStack_a0 = CONCAT44(fVar11,fVar10);
                      plutovg_path_arc_to(path,local_98.x,local_98.y,fStack_90 * 0.017453292,
                                          local_aa,local_a9,fStack_8c,fStack_88);
                      goto LAB_0010abb1;
                    }
                    if ((bVar8 & 0xdf) != 0x5a) {
                      return false;
                    }
                    if ((bVar1 & 0xdf) == 0x5a) {
                      return false;
                    }
                    fVar14 = fVar10;
                    fVar16 = fVar11;
                    fVar17 = fVar12;
                    fVar15 = fVar13;
                    if ((path->elements).size != 0) {
                      ppVar4 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CLOSE,1);
                      *ppVar4 = *(plutovg_path_element_t *)&path->start_point;
                      fVar10 = local_78;
                      fVar11 = fStack_74;
                      fVar12 = fStack_70;
                      fVar13 = fStack_6c;
                      fVar14 = local_78;
                      fVar16 = fStack_74;
                      fVar17 = fStack_70;
                      fVar15 = fStack_6c;
                    }
                    goto LAB_0010ad96;
                  }
                  if ((byte)((bVar1 + 0xbd) * '\x10' | (byte)(bVar1 + 0xbd) >> 4) < 4) {
                    local_98.y = (local_a8.y + local_a8.y) - (float)local_68;
                    local_98.x = (local_a8.x + local_a8.x) - (float)local_58;
                  }
                  _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,2,4);
                  if (!_Var2) {
                    return false;
                  }
                  fVar12 = 0.0;
                  fVar13 = 0.0;
                  fVar14 = 0.0;
                  fVar16 = 0.0;
                  if (bVar8 == 0x73) {
                    fStack_90 = fStack_90 + local_a8.x;
                    fStack_8c = fStack_8c + local_a8.y;
                    fVar12 = (float)uStack_a0 + 0.0;
                    fVar13 = uStack_a0._4_4_ + 0.0;
                    fStack_88 = fStack_88 + local_a8.x;
                    fStack_84 = fStack_84 + local_a8.y;
                    fVar14 = (float)uStack_a0 + 0.0;
                    fVar16 = uStack_a0._4_4_ + 0.0;
                  }
                  fVar10 = local_98.x;
                  fVar11 = local_98.y;
                }
                local_58 = CONCAT44(fStack_8c,fStack_90);
                uStack_50 = CONCAT44(fVar13,fVar12);
                local_68 = CONCAT44(fStack_8c,fStack_8c);
                uStack_60 = CONCAT44(fStack_8c,fStack_8c);
                local_a8.y = fStack_84;
                local_a8.x = fStack_88;
                uStack_a0 = CONCAT44(fVar16,fVar14);
                plutovg_path_cubic_to(path,fVar10,fVar11,fStack_90,fStack_8c,fStack_88,fStack_84);
              }
              goto LAB_0010abb1;
            }
            _Var2 = parse_path_coordinates((char **)&local_80,(char *)end,&local_98.x,1,1);
            if (!_Var2) {
              return false;
            }
            fVar10 = local_98.y;
            if (bVar8 == 0x76) {
              fVar10 = local_98.y + local_a8.y;
              local_98.y = fVar10;
            }
            local_48 = ZEXT416((uint)fVar10);
            plutovg_path_line_to(path,local_a8.x,fVar10);
            fVar10 = local_78;
            fVar11 = fStack_74;
            fVar12 = fStack_70;
            fVar13 = fStack_6c;
            fVar14 = local_a8.x;
            fVar16 = (float)local_48._0_4_;
            fVar17 = (float)uStack_a0;
            fVar15 = uStack_a0._4_4_;
          }
        }
LAB_0010ad96:
        local_a8.x = fVar14;
        local_a8.y = fVar16;
        uStack_a0._0_4_ = fVar17;
        uStack_a0._4_4_ = fVar15;
        bVar1 = bVar8;
      } while (local_80 < end);
    }
  }
  else {
    do {
      if ((0x20 < (ulong)*local_80) || ((0x100002600U >> ((ulong)*local_80 & 0x3f) & 1) == 0))
      goto LAB_0010aac8;
      lVar7 = lVar7 + -1;
      local_80 = local_80 + 1;
    } while (lVar7 != 0);
  }
  return true;
}

Assistant:

bool plutovg_path_parse(plutovg_path_t* path, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;

    float values[6];
    bool flags[2];

    float start_x = 0;
    float start_y = 0;
    float current_x = 0;
    float current_y = 0;
    float last_control_x = 0;
    float last_control_y = 0;

    char command = 0;
    char last_command = 0;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(PLUTOVG_IS_ALPHA(*it)) {
            command = *it++;
            plutovg_skip_ws(&it, end);
        }

        if(!last_command && !(command == 'M' || command == 'm'))
            return false;
        if(command == 'M' || command == 'm') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'm') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_move_to(path, values[0], values[1]);
            current_x = start_x = values[0];
            current_y = start_y = values[1];
            command = command == 'm' ? 'l' : 'L';
        } else if(command == 'L' || command == 'l') {
            if(!parse_path_coordinates(&it, end, values, 0, 2))
                return false;
            if(command == 'l') {
                values[0] += current_x;
                values[1] += current_y;
            }

            plutovg_path_line_to(path, values[0], values[1]);
            current_x = values[0];
            current_y = values[1];
        } else if(command == 'H' || command == 'h') {
            if(!parse_path_coordinates(&it, end, values, 0, 1))
                return false;
            if(command == 'h') {
                values[0] += current_x;
            }

            plutovg_path_line_to(path, values[0], current_y);
            current_x = values[0];
        } else if(command == 'V' || command == 'v') {
            if(!parse_path_coordinates(&it, end, values, 1, 1))
                return false;
            if(command == 'v') {
                values[1] += current_y;
            }

            plutovg_path_line_to(path, current_x, values[1]);
            current_y = values[1];
        } else if(command == 'Q' || command == 'q') {
            if(!parse_path_coordinates(&it, end, values, 0, 4))
                return false;
            if(command == 'q') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'C' || command == 'c') {
            if(!parse_path_coordinates(&it, end, values, 0, 6))
                return false;
            if(command == 'c') {
                values[0] += current_x;
                values[1] += current_y;
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'T' || command == 't') {
            if(last_command != 'Q' && last_command != 'q' && last_command != 'T' && last_command != 't') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 2))
                return false;
            if(command == 't') {
                values[2] += current_x;
                values[3] += current_y;
            }

            plutovg_path_quad_to(path, values[0], values[1], values[2], values[3]);
            last_control_x = values[0];
            last_control_y = values[1];
            current_x = values[2];
            current_y = values[3];
        } else if(command == 'S' || command == 's') {
            if(last_command != 'C' && last_command != 'c' && last_command != 'S' && last_command != 's') {
                values[0] = current_x;
                values[1] = current_y;
            } else {
                values[0] = 2 * current_x - last_control_x;
                values[1] = 2 * current_y - last_control_y;
            }

            if(!parse_path_coordinates(&it, end, values, 2, 4))
                return false;
            if(command == 's') {
                values[2] += current_x;
                values[3] += current_y;
                values[4] += current_x;
                values[5] += current_y;
            }

            plutovg_path_cubic_to(path, values[0], values[1], values[2], values[3], values[4], values[5]);
            last_control_x = values[2];
            last_control_y = values[3];
            current_x = values[4];
            current_y = values[5];
        } else if(command == 'A' || command == 'a') {
            if(!parse_path_coordinates(&it, end, values, 0, 3)
                || !parse_arc_flag(&it, end, &flags[0])
                || !parse_arc_flag(&it, end, &flags[1])
                || !parse_path_coordinates(&it, end, values, 3, 2)) {
                return false;
            }

            if(command == 'a') {
                values[3] += current_x;
                values[4] += current_y;
            }

            plutovg_path_arc_to(path, values[0], values[1], PLUTOVG_DEG2RAD(values[2]), flags[0], flags[1], values[3], values[4]);
            current_x = values[3];
            current_y = values[4];
        } else if(command == 'Z' || command == 'z') {
            if(last_command == 'Z' || last_command == 'z')
                return false;
            plutovg_path_close(path);
            current_x = start_x;
            current_y = start_y;
        } else {
            return false;
        }

        last_command = command;
    }

    return true;
}